

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uchar *q;
  long lVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  size_t sVar14;
  byte *pbVar15;
  char *p2;
  char *p1;
  sqlite3_int64 iVal;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  long local_58;
  byte *local_50;
  byte *local_48;
  char **local_40;
  byte *local_38;
  
  *paOut = (char *)0x0;
  *pnOut = 0;
  local_68 = (byte *)a2;
  local_60 = (byte *)a1;
  local_50 = (byte *)a1;
  iVar4 = sqlite3_initialize();
  if (iVar4 == 0) {
    local_70 = (byte *)sqlite3Malloc((long)n2 + (long)n1 + 0x11);
  }
  else {
    local_70 = (byte *)0x0;
  }
  pbVar15 = local_50;
  if (local_70 == (byte *)0x0) {
    iVar4 = 7;
  }
  else {
    local_48 = local_70;
    local_40 = paOut;
    if (n1 < 1) {
      local_60 = (byte *)0x0;
      lVar12 = 0;
    }
    else {
      iVar4 = sqlite3Fts3GetVarint((char *)local_50,&local_58);
      local_60 = pbVar15 + iVar4;
      lVar12 = local_58;
    }
    if (n2 < 1) {
      local_68 = (byte *)0x0;
      lVar8 = 0;
    }
    else {
      iVar4 = sqlite3Fts3GetVarint(a2,&local_58);
      local_68 = (byte *)(a2 + iVar4);
      lVar8 = local_58;
    }
    local_50 = local_50 + n1;
    local_38 = (byte *)(a2 + n2);
    lVar7 = 0;
    bVar2 = true;
    iVar4 = 0;
    do {
      if (local_60 == (byte *)0x0 && local_68 == (byte *)0x0) break;
      lVar6 = -(lVar12 - lVar8);
      if (bDescDoclist == 0) {
        lVar6 = lVar12 - lVar8;
      }
      if (((local_60 == (byte *)0x0) || (local_68 == (byte *)0x0)) || (lVar6 != 0)) {
        if ((local_68 == (byte *)0x0) || (local_60 != (byte *)0x0 && lVar6 < 0)) {
          uVar11 = lVar7 - lVar12;
          if (bDescDoclist == 0 || bVar2) {
            uVar11 = lVar12 - lVar7;
          }
          do {
            pbVar15 = local_70;
            bVar9 = (byte)uVar11;
            *pbVar15 = bVar9 | 0x80;
            pbVar13 = pbVar15 + 1;
            bVar2 = 0x7f < uVar11;
            uVar11 = uVar11 >> 7;
            local_70 = pbVar13;
          } while (bVar2);
          *pbVar15 = bVar9;
          bVar9 = *local_60;
          pbVar15 = local_60;
          if (bVar9 != 0) {
            do {
              pbVar1 = pbVar15 + 1;
              pbVar15 = pbVar15 + 1;
              bVar10 = bVar9 & 0x80;
              bVar9 = *pbVar1;
            } while (bVar10 != 0 || *pbVar1 != 0);
          }
          pbVar15 = pbVar15 + 1;
          sVar14 = (size_t)((int)pbVar15 - (int)local_60);
          memcpy(pbVar13,local_60,sVar14);
          local_70 = pbVar13 + sVar14;
          if (local_50 <= pbVar15) {
            local_60 = (byte *)0x0;
            lVar7 = lVar12;
            goto LAB_001be3ac;
          }
          local_60 = pbVar15;
          iVar5 = sqlite3Fts3GetVarint((char *)pbVar15,&local_58);
          local_60 = local_60 + iVar5;
          lVar6 = -local_58;
          if (bDescDoclist == 0) {
            lVar6 = local_58;
          }
          bVar3 = true;
          lVar7 = lVar12;
          lVar12 = lVar6 + lVar12;
        }
        else {
          uVar11 = lVar7 - lVar8;
          if ((bool)(bDescDoclist == 0 | bVar2)) {
            uVar11 = lVar8 - lVar7;
          }
          do {
            pbVar15 = local_70;
            bVar9 = (byte)uVar11;
            *pbVar15 = bVar9 | 0x80;
            pbVar13 = pbVar15 + 1;
            bVar2 = 0x7f < uVar11;
            uVar11 = uVar11 >> 7;
            local_70 = pbVar13;
          } while (bVar2);
          *pbVar15 = bVar9;
          bVar9 = *local_68;
          pbVar15 = local_68;
          if (bVar9 != 0) {
            do {
              pbVar1 = pbVar15 + 1;
              pbVar15 = pbVar15 + 1;
              bVar10 = bVar9 & 0x80;
              bVar9 = *pbVar1;
            } while (bVar10 != 0 || *pbVar1 != 0);
          }
          pbVar15 = pbVar15 + 1;
          sVar14 = (size_t)((int)pbVar15 - (int)local_68);
          memcpy(pbVar13,local_68,sVar14);
          local_70 = pbVar13 + sVar14;
          lVar7 = lVar8;
          if (pbVar15 < local_38) {
            local_68 = pbVar15;
            iVar5 = sqlite3Fts3GetVarint((char *)pbVar15,&local_58);
            local_68 = local_68 + iVar5;
            lVar6 = -local_58;
            if (bDescDoclist == 0) {
              lVar6 = local_58;
            }
            bVar3 = true;
            lVar8 = lVar6 + lVar8;
          }
          else {
            local_68 = (byte *)0x0;
LAB_001be3ac:
            bVar3 = true;
          }
        }
      }
      else {
        uVar11 = lVar7 - lVar12;
        if (bVar2) {
          uVar11 = lVar12 - lVar7;
        }
        if (bDescDoclist == 0) {
          uVar11 = lVar12 - lVar7;
        }
        do {
          pbVar15 = local_70;
          bVar9 = (byte)uVar11;
          *pbVar15 = bVar9 | 0x80;
          local_70 = pbVar15 + 1;
          bVar2 = 0x7f < uVar11;
          uVar11 = uVar11 >> 7;
        } while (bVar2);
        *pbVar15 = bVar9;
        iVar4 = fts3PoslistMerge((char **)&local_70,(char **)&local_60,(char **)&local_68);
        pbVar15 = local_60;
        if (iVar4 == 0) {
          if (local_60 < local_50) {
            iVar4 = sqlite3Fts3GetVarint((char *)local_60,&local_58);
            local_60 = pbVar15 + iVar4;
            lVar7 = -local_58;
            if (bDescDoclist == 0) {
              lVar7 = local_58;
            }
            lVar6 = lVar7 + lVar12;
          }
          else {
            local_60 = (byte *)0x0;
            lVar6 = lVar12;
          }
          pbVar15 = local_68;
          if (local_68 < local_38) {
            iVar4 = sqlite3Fts3GetVarint((char *)local_68,&local_58);
            local_68 = pbVar15 + iVar4;
            lVar7 = -local_58;
            if (bDescDoclist == 0) {
              lVar7 = local_58;
            }
            bVar3 = true;
            iVar4 = 0;
            lVar8 = lVar7 + lVar8;
            lVar7 = lVar12;
            lVar12 = lVar6;
          }
          else {
            local_68 = (byte *)0x0;
            bVar3 = true;
            iVar4 = 0;
            lVar7 = lVar12;
            lVar12 = lVar6;
          }
        }
        else {
          bVar3 = false;
          lVar7 = lVar12;
        }
      }
      bVar2 = false;
    } while (bVar3);
    if (iVar4 == 0) {
      local_70[0] = 0;
      local_70[1] = 0;
      local_70[2] = 0;
      local_70[3] = 0;
      local_70[4] = 0;
      local_70[5] = 0;
      local_70[6] = 0;
      local_70[7] = 0;
    }
    else {
      sqlite3_free(local_48);
      local_70 = (byte *)0x0;
      local_48 = (byte *)0x0;
    }
    *local_40 = (char *)local_48;
    *pnOut = (int)local_70 - (int)local_48;
  }
  return iVar4;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the 
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list 
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from 
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow. 
  **
  ** A symetric argument may be made if the doclists are in descending 
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}